

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O2

void __thiscall avro::json::JsonGenerator::encodeNumber(JsonGenerator *this,double t)

{
  char *pcVar1;
  char *pcVar2;
  ostringstream oss;
  uint8_t *local_1a8;
  size_t local_1a0;
  ostream local_188;
  
  sep(this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  if ((ulong)ABS(t) < 0x7ff0000000000000) {
    std::ostream::_M_insert<double>(t);
  }
  else {
    pcVar1 = "-Infinity";
    if (INFINITY <= t) {
      pcVar1 = "Infinity";
    }
    pcVar2 = "NaN";
    if (!NAN(t)) {
      pcVar2 = pcVar1;
    }
    std::operator<<(&local_188,pcVar2);
  }
  std::__cxx11::stringbuf::str();
  StreamWriter::writeBytes(&this->out_,local_1a8,local_1a0);
  if (this->top == stKey) {
    this->top = stMapN;
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return;
}

Assistant:

void JsonGenerator::encodeNumber(double t) {
    sep();
    std::ostringstream oss;
    if (boost::math::isfinite(t)) {
        oss << t;
    } else if (boost::math::isnan(t)) {
        oss << "NaN";
    } else if (t == std::numeric_limits<double>::infinity()) {
        oss << "Infinity";
    } else {
        oss << "-Infinity";
    }
    const std::string& s = oss.str();
    out_.writeBytes(reinterpret_cast<const uint8_t*>(&s[0]), s.size());
    sep2();
}